

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

int Fra_ClausRunBmc(Clu_Man_t *p)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  int iVar4;
  int iVar5;
  int Lits [2];
  
  iVar1 = p->pCnf->nVars;
  pAVar3 = Aig_ManCo(p->pAig,0);
  iVar5 = -1;
  iVar4 = 0;
  do {
    iVar5 = iVar5 + 1;
    if (p->nFrames + p->nPref <= iVar5) {
      return 1;
    }
    Lits[0] = (iVar4 + p->pCnf->pVarNums[pAVar3->Id]) * 2;
    iVar2 = sat_solver_solve(p->pSatBmc,Lits,Lits + 1,(long)p->nBTLimit,0,0,0);
    iVar4 = iVar4 + iVar1;
  } while (iVar2 == -1);
  return 0;
}

Assistant:

int Fra_ClausRunBmc( Clu_Man_t * p )
{
    Aig_Obj_t * pObj;
    int Lits[2], nLitsTot, RetValue, i;
    // set the output literals
    nLitsTot = 2 * p->pCnf->nVars;
    pObj = Aig_ManCo(p->pAig, 0);
    for ( i = 0; i < p->nPref + p->nFrames; i++ )
    {
        Lits[0] = i * nLitsTot + toLitCond( p->pCnf->pVarNums[pObj->Id], 0 ); 
        RetValue = sat_solver_solve( p->pSatBmc, Lits, Lits + 1, (ABC_INT64_T)p->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( RetValue != l_False )
            return 0;
    }
    return 1;
}